

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O0

void __thiscall
qclab::qgates::Phase<std::complex<float>_>::Phase
          (Phase<std::complex<float>_> *this,int qubit,real_type cos,real_type sin,bool fixed)

{
  bool fixed_local;
  real_type sin_local;
  real_type cos_local;
  int qubit_local;
  Phase<std::complex<float>_> *this_local;
  
  QGate1<std::complex<float>_>::QGate1(&this->super_QGate1<std::complex<float>_>,qubit);
  QAdjustable::QAdjustable
            ((QAdjustable *)&(this->super_QGate1<std::complex<float>_>).field_0xc,fixed);
  (this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0016c1e8;
  QAngle<float>::QAngle(&this->angle_,cos,sin);
  return;
}

Assistant:

Phase( const int qubit , const real_type cos , const real_type sin ,
               const bool fixed = false )
        : QGate1< T >( qubit )
        , angle_( cos , sin )
        , QAdjustable( fixed )
        { }